

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqmodules.cpp
# Opt level: O0

SQInteger SqModules::sqRequire<true>(HSQUIRRELVM vm)

{
  HSQOBJECT obj;
  HSQOBJECT obj_00;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  SQRESULT SVar4;
  pointer ppVar5;
  HSQOBJECT *pHVar6;
  SQObjectValue in_RDI;
  string errMsg;
  Object exports;
  iterator nativeIt;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>
  *nm;
  iterator __end2;
  iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>_>_>
  *__range2;
  SQInteger idx;
  SQInteger fileNameLen;
  char *fileName;
  SqModules *self;
  SQUserPointer selfPtr;
  string *in_stack_000002f0;
  Object *in_stack_000002f8;
  char *in_stack_00000300;
  undefined1 in_stack_0000030f;
  char *in_stack_00000310;
  SqModules *in_stack_00000318;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>_>_>
  *in_stack_fffffffffffffe88;
  HSQUIRRELVM in_stack_fffffffffffffe90;
  HSQUIRRELVM in_stack_fffffffffffffe98;
  SQInteger in_stack_fffffffffffffea0;
  HSQUIRRELVM in_stack_fffffffffffffea8;
  HSQUIRRELVM in_stack_fffffffffffffeb0;
  HSQUIRRELVM v;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  SQObjectValue in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined1 local_e8 [56];
  SQAllocContext local_b0;
  SQObjectValue local_a8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>,_true>
  local_a0 [3];
  allocator<char> local_81;
  string local_80 [32];
  SQObjectValue local_60;
  reference local_58;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>,_true>
  local_48;
  SQObjectValue local_40;
  long local_38;
  SQGETTHREAD local_30;
  char *local_28;
  SQObjectValue local_20;
  SQTable *local_18;
  SQObjectValue local_10;
  SQRESULT local_8;
  
  local_18 = (SQTable *)0x0;
  local_10 = in_RDI;
  SVar4 = sq_getuserpointer(in_stack_fffffffffffffe98,(SQInteger)in_stack_fffffffffffffe90,
                            (SQUserPointer *)in_stack_fffffffffffffe88);
  if ((SVar4 < 0) || (local_18 == (SQTable *)0x0)) {
    local_8 = sq_throwerror(in_stack_fffffffffffffe90,(SQChar *)in_stack_fffffffffffffe88);
  }
  else {
    local_20.pTable = local_18;
    local_28 = (char *)0x0;
    local_30 = (SQGETTHREAD)0xffffffffffffffff;
    sq_getstringandsize(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                        (SQChar **)in_stack_fffffffffffffe98,(SQInteger *)in_stack_fffffffffffffe90)
    ;
    iVar3 = strcmp(local_28,"quirrel.native_modules");
    if (iVar3 == 0) {
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>_>_>
      ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>_>_>
              *)0x1dba8e);
      sq_newarray((HSQUIRRELVM)in_stack_fffffffffffffec0.pTable,
                  CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      local_38 = 0;
      local_40.pTable = (SQTable *)&(local_20.pTable)->_alloc_ctx;
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>_>_>
           ::begin(in_stack_fffffffffffffe88);
      local_50._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>_>_>
           ::end(in_stack_fffffffffffffe88);
      while( true ) {
        bVar1 = std::__detail::operator!=(&local_48,&local_50);
        if (!bVar1) break;
        local_58 = std::__detail::
                   _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>,_false,_true>
                   ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>,_false,_true>
                                *)0x1dbb10);
        sq_pushinteger((HSQUIRRELVM)in_stack_fffffffffffffec0.pTable,
                       CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
        std::__cxx11::string::data();
        sq_pushstring((HSQUIRRELVM)in_stack_fffffffffffffec0.pTable,
                      (SQChar *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                      (SQInteger)in_stack_fffffffffffffeb0);
        sq_set(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
        local_38 = local_38 + 1;
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>,_false,_true>
                      *)in_stack_fffffffffffffe90);
      }
      local_8 = 1;
    }
    else {
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &((local_20.pGenerator)->_stack)._size;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,in_stack_fffffffffffffec8,(allocator<char> *)in_stack_fffffffffffffec0.pTable)
      ;
      local_60 = (SQObjectValue)
                 std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>_>_>
                 ::find(in_stack_fffffffffffffe88,(key_type *)0x1dbc01);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator(&local_81);
      local_a0[0]._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>_>_>
           ::end(in_stack_fffffffffffffe88);
      bVar1 = std::__detail::operator!=
                        ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>,_true>
                          *)&local_60,local_a0);
      if (bVar1) {
        ppVar5 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sqrat::Object>,_false,_true>
                               *)0x1dbc80);
        pHVar6 = Sqrat::Object::GetObject(&ppVar5->second);
        local_b0 = *(SQAllocContext *)pHVar6;
        local_a8 = pHVar6->_unVal;
        obj._7_1_ = in_stack_fffffffffffffebf;
        obj._type = (int)in_stack_fffffffffffffeb8;
        obj._flags = (char)((uint7)in_stack_fffffffffffffeb8 >> 0x20);
        obj._5_2_ = (short)((uint7)in_stack_fffffffffffffeb8 >> 0x28);
        obj._unVal.pTable = local_10.pTable;
        sq_pushobject(in_stack_fffffffffffffeb0,obj);
        local_8 = 1;
      }
      else {
        Sqrat::Object::Object((Object *)0x1dbd29);
        v = (HSQUIRRELVM)local_e8;
        std::__cxx11::string::string((string *)v);
        uVar2 = requireModule(in_stack_00000318,in_stack_00000310,(bool)in_stack_0000030f,
                              in_stack_00000300,in_stack_000002f8,in_stack_000002f0);
        if ((bool)uVar2) {
          Sqrat::Object::GetObject((Object *)(local_e8 + 0x20));
          obj_00._7_1_ = uVar2;
          obj_00._type = (int)in_stack_fffffffffffffeb8;
          obj_00._flags = (char)((uint7)in_stack_fffffffffffffeb8 >> 0x20);
          obj_00._5_2_ = (short)((uint7)in_stack_fffffffffffffeb8 >> 0x28);
          obj_00._unVal.pTable = in_stack_fffffffffffffec0.pTable;
          sq_pushobject(v,obj_00);
          local_8 = 1;
        }
        else {
          std::__cxx11::string::c_str();
          local_8 = sq_throwerror(in_stack_fffffffffffffe90,(SQChar *)in_stack_fffffffffffffe88);
        }
        std::__cxx11::string::~string((string *)local_e8);
        Sqrat::Object::~Object((Object *)0x1dbe57);
      }
    }
  }
  return local_8;
}

Assistant:

SQInteger SqModules::sqRequire(HSQUIRRELVM vm)
{
  SQUserPointer selfPtr = nullptr;
  if (SQ_FAILED(sq_getuserpointer(vm, -1, &selfPtr)) || !selfPtr)
    return sq_throwerror(vm, "No module manager");

  SqModules *self = reinterpret_cast<SqModules *>(selfPtr);
  SQRAT_ASSERT(self->sqvm == vm);

  const char *fileName = nullptr;
  SQInteger fileNameLen = -1;
  sq_getstringandsize(vm, 2, &fileName, &fileNameLen);

  if (strcmp(fileName, "quirrel.native_modules")==0)
  {
    sq_newarray(vm, self->nativeModules.size());
    SQInteger idx = 0;
    for (auto &nm : self->nativeModules)
    {
      sq_pushinteger(vm, idx);
      sq_pushstring(vm, nm.first.data(), -1);
      sq_set(vm, -3);
      ++idx;
    }
    return 1;
  }

  auto nativeIt = self->nativeModules.find(fileName);
  if (nativeIt != self->nativeModules.end())
  {
    sq_pushobject(vm, nativeIt->second.GetObject());
    return 1;
  }

  Sqrat::Object exports;
  string errMsg;
  if (!self->requireModule(fileName, must_exist, __fn__, exports, errMsg))
    return sq_throwerror(vm, errMsg.c_str());

  sq_pushobject(vm, exports.GetObject());
  return 1;
}